

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall picojson::default_parse_context::set_bool(default_parse_context *this,bool b)

{
  value local_28;
  undefined1 local_11;
  default_parse_context *pdStack_10;
  bool b_local;
  default_parse_context *this_local;
  
  local_11 = b;
  pdStack_10 = this;
  picojson::value::value(&local_28,b);
  picojson::value::operator=(this->out_,&local_28);
  picojson::value::~value(&local_28);
  return true;
}

Assistant:

bool set_bool(bool b) {
      *out_ = value(b);
      return true;
    }